

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::DataSet(DataSet *this,string *filepath,ReadInfo *read_info)

{
  (this->m_filepath)._M_dataplus._M_p = (pointer)&(this->m_filepath).field_2;
  (this->m_filepath)._M_string_length = 0;
  (this->m_filepath).field_2._M_local_buf[0] = '\0';
  (this->m_matrix).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_matrix).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_matrix).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_labels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_labels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_labels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_matrix).m_shape.n_row = 0;
  (this->m_matrix).m_shape.n_col = 0;
  (this->m_matrix).m_shape.is_diogonal = false;
  load(this,filepath,read_info);
  return;
}

Assistant:

DataSet::DataSet(const std::string& filepath, const ReadInfo& read_info){
    load(filepath, read_info);
}